

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O0

void rw::wdgl::printPipeinfo(Atomic *a)

{
  Geometry *pGVar1;
  InstanceDataHeader *pIVar2;
  int local_2c;
  int i;
  InstanceDataHeader *h;
  int32 plgid;
  Geometry *g;
  Atomic *a_local;
  
  pGVar1 = a->geometry;
  if ((pGVar1->instData != (InstanceDataHeader *)0x0) && (pGVar1->instData->platform == 0xb)) {
    h._4_4_ = 0;
    if (a->pipeline != (ObjPipeline *)0x0) {
      h._4_4_ = (a->pipeline->super_Pipeline).pluginID;
    }
    printf("%s %x: ",debugFile,(ulong)h._4_4_);
    pIVar2 = pGVar1->instData;
    for (local_2c = 0; local_2c < (int)pIVar2[1].platform; local_2c = local_2c + 1) {
      printf("%x(%x) ",(ulong)*(uint *)(*(long *)(pIVar2 + 2) + (long)local_2c * 0x18),
             (ulong)*(uint *)(*(long *)(pIVar2 + 2) + (long)local_2c * 0x18 + 4));
    }
    printf("\n");
  }
  return;
}

Assistant:

void
printPipeinfo(Atomic *a)
{
	Geometry *g = a->geometry;
	if(g->instData == nil || g->instData->platform != PLATFORM_WDGL)
		return;
	int32 plgid = 0;
	if(a->pipeline)
		plgid = a->pipeline->pluginID;
	printf("%s %x: ", debugFile, plgid);
	InstanceDataHeader *h = (InstanceDataHeader*)g->instData;
	for(int i = 0; i < h->numAttribs; i++)
		printf("%x(%x) ", h->attribs[i].index, h->attribs[i].type);
	printf("\n");
}